

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

vector<double,_std::allocator<double>_> * Util::EigenVec2Std(VectorXd *vec1)

{
  Index IVar1;
  Scalar *pSVar2;
  reference pvVar3;
  value_type_conflict1 *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int ii;
  int n;
  vector<double,_std::allocator<double>_> *vec2;
  Index in_stack_ffffffffffffff88;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffff90;
  allocator_type *in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *this;
  undefined4 local_38;
  
  this = in_RDI;
  IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff90
                    );
  std::allocator<double>::allocator((allocator<double> *)0x114808);
  std::vector<double,_std::allocator<double>_>::vector
            (this,(size_type)in_RDI,in_RSI,in_stack_ffffffffffffff98);
  std::allocator<double>::~allocator((allocator<double> *)0x11482d);
  for (local_38 = 0; local_38 < (int)IVar1; local_38 = local_38 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff90 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)*pSVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this,(long)local_38);
    *pvVar3 = (value_type)in_stack_ffffffffffffff90;
  }
  return in_RDI;
}

Assistant:

std::vector<double> EigenVec2Std(Eigen::VectorXd vec1){
		
		//locals
		int n = vec1.size();
		std::vector<double> vec2(n,0);

		//loop
		for (int ii = 0; ii < n; ++ii){
			vec2[ii] = vec1[ii];
		}

		//output
		return vec2;
	}